

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int ThreadPoolAddPersistent(ThreadPool *tp,ThreadPoolJob *job,int *jobId)

{
  ThreadPriority TVar1;
  long lVar2;
  ThreadPoolJob *pTVar3;
  ThreadPoolJob *temp;
  int tempId;
  int ret;
  int *jobId_local;
  ThreadPoolJob *job_local;
  ThreadPool *tp_local;
  
  temp._4_4_ = 0;
  temp._0_4_ = 0xffffffff;
  if ((tp == (ThreadPool *)0x0) || (job == (ThreadPoolJob *)0x0)) {
    return 0x16;
  }
  _tempId = (ThreadPoolJob **)jobId;
  if (jobId == (int *)0x0) {
    _tempId = &temp;
  }
  jobId_local = (int *)job;
  job_local = (ThreadPoolJob *)tp;
  *(int *)_tempId = 0x20000000;
  pthread_mutex_lock((pthread_mutex_t *)job_local);
  if (*(int *)&job_local[3].func < *(int *)((long)&job_local[10].func + 4)) {
    CreateWorker((ThreadPool *)job_local);
  }
  else if (*(int *)&job_local[3].func - *(int *)((long)&job_local[3].arg + 4) == 1) {
    temp._4_4_ = 0x20000000;
    goto LAB_0012ca84;
  }
  pTVar3 = CreateThreadPoolJob((ThreadPoolJob *)jobId_local,job_local[2].priority,
                               (ThreadPool *)job_local);
  if (pTVar3 == (ThreadPoolJob *)0x0) {
    temp._4_4_ = 0x20000000;
  }
  else {
    *(ThreadPoolJob **)&job_local[9].priority = pTVar3;
    pthread_cond_signal((pthread_cond_t *)&job_local->priority);
    while (lVar2._0_4_ = job_local[9].priority, lVar2._4_4_ = job_local[9].jobId, lVar2 != 0) {
      pthread_cond_wait((pthread_cond_t *)&job_local[1].priority,(pthread_mutex_t *)job_local);
    }
    TVar1 = job_local[2].priority;
    job_local[2].priority = TVar1 + MED_PRIORITY;
    *(ThreadPriority *)_tempId = TVar1;
  }
LAB_0012ca84:
  pthread_mutex_unlock((pthread_mutex_t *)job_local);
  return temp._4_4_;
}

Assistant:

int ThreadPoolAddPersistent(ThreadPool *tp, ThreadPoolJob *job, int *jobId)
{
	int ret = 0;
	int tempId = -1;
	ThreadPoolJob *temp = NULL;

	if (!tp || !job) {
		return EINVAL;
	}
	if (!jobId) {
		jobId = &tempId;
	}
	*jobId = INVALID_JOB_ID;

	ithread_mutex_lock(&tp->mutex);

	/* Create A worker if less than max threads running */
	if (tp->totalThreads < tp->attr.maxThreads) {
		CreateWorker(tp);
	} else {
		/* if there is more than one worker thread
		 * available then schedule job, otherwise fail */
		if (tp->totalThreads - tp->persistentThreads - 1 == 0) {
			ret = EMAXTHREADS;
			goto exit_function;
		}
	}
	temp = CreateThreadPoolJob(job, tp->lastJobId, tp);
	if (!temp) {
		ret = EOUTOFMEM;
		goto exit_function;
	}
	tp->persistentJob = temp;

	/* Notify a waiting thread */
	ithread_cond_signal(&tp->condition);

	/* wait until long job has been picked up */
	while (tp->persistentJob)
		ithread_cond_wait(&tp->start_and_shutdown, &tp->mutex);
	*jobId = tp->lastJobId++;

exit_function:
	ithread_mutex_unlock(&tp->mutex);

	return ret;
}